

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O0

Polynom<Complex> __thiscall Polynom<Complex>::ordinalAdd(Polynom<Complex> *this,Polynom<Complex> *a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  Complex *pCVar6;
  Complex *extraout_RDX;
  Complex *extraout_RDX_00;
  Complex *extraout_RDX_01;
  Matrix<Complex> *in_RDI;
  Polynom<Complex> PVar7;
  uint i_1;
  int i;
  int degdiff;
  Polynom<Complex> *x;
  undefined4 in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe6c;
  Complex *in_stack_fffffffffffffe70;
  Polynom<Complex> *in_stack_fffffffffffffe88;
  MatrixRow<Complex_&> in_stack_ffffffffffffff10;
  MatrixRow<const_Complex_&> in_stack_ffffffffffffff18;
  uint local_dc;
  MatrixRow<Complex_&> local_d8;
  MatrixRow<const_Complex_&> local_d0;
  MatrixRow<const_Complex_&> local_c8 [12];
  Polynom<Complex> *in_stack_ffffffffffffff98;
  MatrixRow<Complex_&> local_40;
  MatrixRow<const_Complex_&> local_38;
  uint local_30;
  undefined1 local_29;
  uint local_28;
  
  bVar1 = isOrdinal(in_stack_ffffffffffffff98);
  if ((bVar1) && (bVar1 = isOrdinal(in_stack_ffffffffffffff98), bVar1)) {
    iVar2 = degree(in_stack_fffffffffffffe88);
    if (iVar2 < 0) {
      Polynom((Polynom<Complex> *)in_stack_fffffffffffffe70,
              (Polynom<Complex> *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      pCVar6 = extraout_RDX;
    }
    else {
      iVar2 = degree(in_stack_fffffffffffffe88);
      iVar3 = degree(in_stack_fffffffffffffe88);
      local_28 = iVar2 - iVar3;
      if ((int)local_28 < 0) {
        Polynom((Polynom<Complex> *)in_stack_fffffffffffffe70,
                (Polynom<Complex> *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        pCVar6 = extraout_RDX_00;
      }
      else {
        local_29 = 0;
        degree(in_stack_fffffffffffffe88);
        Polynom((Polynom<Complex> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        for (local_30 = 0; (int)local_30 < (int)local_28; local_30 = local_30 + 1) {
          local_38.arr = (Complex *)
                         Matrix<Complex>::operator[]
                                   ((Matrix<Complex> *)
                                    CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0)
          ;
          Matrix<Complex>::MatrixRow<const_Complex_&>::operator[](&local_38,local_30);
          local_40.arr = (Complex *)
                         Matrix<Complex>::operator[]
                                   ((Matrix<Complex> *)
                                    CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0)
          ;
          Matrix<Complex>::MatrixRow<Complex_&>::operator[](&local_40,local_30);
          Complex::operator=(in_stack_fffffffffffffe70,
                             (Complex *)
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        }
        local_c8[0].arr =
             (Complex *)
             Matrix<Complex>::operator[]
                       ((Matrix<Complex> *)
                        CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0);
        Matrix<Complex>::MatrixRow<const_Complex_&>::operator[](local_c8,local_28);
        local_d0.arr = (Complex *)
                       Matrix<Complex>::operator[]
                                 ((Matrix<Complex> *)
                                  CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0);
        Matrix<Complex>::MatrixRow<const_Complex_&>::operator[](&local_d0,0);
        ::operator+(in_stack_ffffffffffffff18.arr,in_stack_ffffffffffffff10.arr);
        local_d8.arr = (Complex *)
                       Matrix<Complex>::operator[]
                                 ((Matrix<Complex> *)
                                  CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0);
        Matrix<Complex>::MatrixRow<Complex_&>::operator[](&local_d8,local_28);
        Complex::operator=(in_stack_fffffffffffffe70,
                           (Complex *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
        ;
        Complex::~Complex(in_stack_fffffffffffffe70);
        local_dc = local_28;
        while( true ) {
          local_dc = local_dc + 1;
          uVar4 = Matrix<Complex>::width(in_RDI);
          pCVar6 = extraout_RDX_01;
          if (uVar4 <= local_dc) break;
          Matrix<Complex>::operator[]
                    ((Matrix<Complex> *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0);
          Matrix<Complex>::MatrixRow<const_Complex_&>::operator[]
                    ((MatrixRow<const_Complex_&> *)&stack0xffffffffffffff18,local_dc - local_28);
          Matrix<Complex>::operator[]
                    ((Matrix<Complex> *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0);
          pCVar6 = Matrix<Complex>::MatrixRow<Complex_&>::operator[]
                             ((MatrixRow<Complex_&> *)&stack0xffffffffffffff10,local_dc);
          Complex::operator=(pCVar6,(Complex *)
                                    CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        }
      }
    }
    PVar7.m.arr = pCVar6;
    PVar7.m._0_8_ = in_RDI;
    return (Polynom<Complex>)PVar7.m;
  }
  uVar5 = __cxa_allocate_exception(0x10);
  matrix_error::runtime_error
            ((matrix_error *)in_stack_fffffffffffffe70,
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  __cxa_throw(uVar5,&matrix_error::typeinfo,matrix_error::~matrix_error);
}

Assistant:

const Polynom<Field> Polynom<Field>::ordinalAdd(const Polynom &a) const
{
    if(!isOrdinal() || !a.isOrdinal())
        throw matrix_error("Invalid ordinal");
    if(a.degree() < 0)
        return *this;
    int degdiff = degree() - a.degree();
    if(degdiff < 0)
        return a;
    Polynom x(degree() + 1);
    for(int i = 0; i < degdiff; ++i)
    {
        x.m[0][i] = m[0][i];
    }
    x.m[0][degdiff] = m[0][degdiff] + a.m[0][0];
    for(unsigned i = degdiff + 1; i < x.m.width(); ++i)
    {
        x.m[0][i] = a.m[0][i - degdiff];
    }
    return x;
}